

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleon.h
# Opt level: O1

bool __thiscall
trento::NucleonCommon::participate(NucleonCommon *this,NucleonData *A,NucleonData *B)

{
  normal_distribution<double> *pnVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pointer pCVar4;
  pointer pCVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  long lVar8;
  bool bVar9;
  pointer pCVar10;
  ulong uVar11;
  Constituent *qB;
  pointer pCVar12;
  Constituent *constituent;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  result_type_conflict rVar23;
  result_type_conflict rVar24;
  result_type_conflict rVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_ZMM3 [64];
  undefined1 in_XMM7 [16];
  
  if (((A->is_participant_ != true) || (B->is_participant_ != true)) ||
     (bVar9 = true, this->calc_ncoll_ == true)) {
    auVar33._0_8_ = A->x_;
    auVar33._8_8_ = A->y_;
    auVar13._0_8_ = B->x_;
    auVar13._8_8_ = B->y_;
    auVar33 = vsubpd_avx(auVar33,auVar13);
    if (auVar33._0_8_ * auVar33._0_8_ + auVar33._8_8_ * auVar33._8_8_ <= this->max_impact_sq_) {
      if (A->constituents_exist_ == false) {
        std::
        vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
        ::resize(&A->constituents_,this->constituent_number_);
        auVar33 = in_ZMM3._0_16_;
        pCVar10 = (A->constituents_).
                  super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar4 = (A->constituents_).
                 super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pCVar10 == pCVar4) {
          dVar26 = 0.0;
          dVar27 = 0.0;
        }
        else {
          pnVar1 = &this->constituent_position_dist_;
          dVar27 = 0.0;
          dVar26 = 0.0;
          do {
            rVar23 = std::normal_distribution<double>::operator()
                               (pnVar1,(mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                        *)&random::engine,&pnVar1->_M_param);
            rVar24 = std::normal_distribution<double>::operator()
                               (pnVar1,(mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                        *)&random::engine,&pnVar1->_M_param);
            pCVar10->x = rVar23;
            pCVar10->y = rVar24;
            rVar25 = std::gamma_distribution<double>::operator()
                               (&this->participant_fluctuation_dist_,
                                (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                 *)&random::engine,&(this->participant_fluctuation_dist_)._M_param);
            auVar33 = in_ZMM3._0_16_;
            pCVar10->fluctuation = rVar25;
            dVar27 = dVar27 + rVar23;
            dVar26 = dVar26 + rVar24;
            pCVar10 = pCVar10 + 1;
          } while (pCVar10 != pCVar4);
        }
        pCVar10 = (A->constituents_).
                  super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar4 = (A->constituents_).
                 super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pCVar10 != pCVar4) {
          lVar8 = -0x18 - (long)pCVar10;
          auVar14 = vpbroadcastq_avx512f();
          auVar33 = vcvtusi2sd_avx512f(auVar33,this->constituent_number_);
          auVar14 = vpsrlq_avx512f(auVar14,4);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = A->x_ - dVar27 / auVar33._0_8_;
          auVar15 = vbroadcastsd_avx512f(auVar29);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = A->y_ - dVar26 / auVar33._0_8_;
          auVar16 = vbroadcastsd_avx512f(auVar31);
          uVar11 = 0;
          auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          do {
            auVar18 = vpbroadcastq_avx512f();
            auVar18 = vporq_avx512f(auVar18,auVar17);
            uVar6 = vpcmpuq_avx512f(auVar18,auVar14,2);
            auVar18 = vgatherdpd_avx512f(*(undefined4 *)&pCVar10->x);
            auVar19._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar18._8_8_;
            auVar19._0_8_ = (ulong)((byte)uVar6 & 1) * auVar18._0_8_;
            auVar19._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar18._16_8_;
            auVar19._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar18._24_8_;
            auVar19._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar18._32_8_;
            auVar19._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar18._40_8_;
            auVar19._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar18._48_8_;
            auVar19._56_8_ = (uVar6 >> 7) * auVar18._56_8_;
            auVar18 = vaddpd_avx512f(auVar15,auVar19);
            vscatterdpd_avx512f(ZEXT864(pCVar10) + ZEXT3264(_DAT_00125340),uVar6,auVar18);
            auVar18 = vgatherdpd_avx512f(*(undefined4 *)&pCVar10->y);
            auVar20._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar18._8_8_;
            auVar20._0_8_ = (ulong)((byte)uVar6 & 1) * auVar18._0_8_;
            auVar20._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar18._16_8_;
            auVar20._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar18._24_8_;
            auVar20._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar18._32_8_;
            auVar20._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar18._40_8_;
            auVar20._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar18._48_8_;
            auVar20._56_8_ = (uVar6 >> 7) * auVar18._56_8_;
            auVar18 = vaddpd_avx512f(auVar16,auVar20);
            vscatterdpd_avx512f(ZEXT864(pCVar10) + ZEXT3264(_DAT_00125360),uVar6,auVar18);
            uVar11 = uVar11 + 8;
            pCVar10 = pCVar10 + 8;
          } while (((ulong)((long)pCVar4 + lVar8) / 0x18 + 8 & 0xfffffffffffffff8) != uVar11);
        }
        A->constituents_exist_ = true;
      }
      if (B->constituents_exist_ == false) {
        std::
        vector<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
        ::resize(&B->constituents_,this->constituent_number_);
        pCVar10 = (B->constituents_).
                  super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar4 = (B->constituents_).
                 super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pCVar10 == pCVar4) {
          dVar26 = 0.0;
          dVar27 = 0.0;
        }
        else {
          pnVar1 = &this->constituent_position_dist_;
          dVar27 = 0.0;
          dVar26 = 0.0;
          do {
            rVar23 = std::normal_distribution<double>::operator()
                               (pnVar1,(mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                        *)&random::engine,&pnVar1->_M_param);
            rVar24 = std::normal_distribution<double>::operator()
                               (pnVar1,(mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                        *)&random::engine,&pnVar1->_M_param);
            pCVar10->x = rVar23;
            pCVar10->y = rVar24;
            rVar25 = std::gamma_distribution<double>::operator()
                               (&this->participant_fluctuation_dist_,
                                (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                 *)&random::engine,&(this->participant_fluctuation_dist_)._M_param);
            pCVar10->fluctuation = rVar25;
            dVar27 = dVar27 + rVar23;
            dVar26 = dVar26 + rVar24;
            pCVar10 = pCVar10 + 1;
          } while (pCVar10 != pCVar4);
        }
        pCVar10 = (B->constituents_).
                  super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar4 = (B->constituents_).
                 super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pCVar10 != pCVar4) {
          lVar8 = -0x18 - (long)pCVar10;
          auVar14 = vpbroadcastq_avx512f();
          auVar33 = vcvtusi2sd_avx512f(in_XMM7,this->constituent_number_);
          auVar14 = vpsrlq_avx512f(auVar14,4);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = B->x_ - dVar27 / auVar33._0_8_;
          auVar15 = vbroadcastsd_avx512f(auVar30);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = B->y_ - dVar26 / auVar33._0_8_;
          auVar16 = vbroadcastsd_avx512f(auVar32);
          uVar11 = 0;
          auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          do {
            auVar18 = vpbroadcastq_avx512f();
            auVar18 = vporq_avx512f(auVar18,auVar17);
            uVar6 = vpcmpuq_avx512f(auVar18,auVar14,2);
            auVar18 = vgatherdpd_avx512f(*(undefined4 *)&pCVar10->x);
            auVar21._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar18._8_8_;
            auVar21._0_8_ = (ulong)((byte)uVar6 & 1) * auVar18._0_8_;
            auVar21._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar18._16_8_;
            auVar21._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar18._24_8_;
            auVar21._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar18._32_8_;
            auVar21._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar18._40_8_;
            auVar21._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar18._48_8_;
            auVar21._56_8_ = (uVar6 >> 7) * auVar18._56_8_;
            auVar18 = vaddpd_avx512f(auVar15,auVar21);
            vscatterdpd_avx512f(ZEXT864(pCVar10) + ZEXT3264(_DAT_00125340),uVar6,auVar18);
            auVar18 = vgatherdpd_avx512f(*(undefined4 *)&pCVar10->y);
            auVar22._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar18._8_8_;
            auVar22._0_8_ = (ulong)((byte)uVar6 & 1) * auVar18._0_8_;
            auVar22._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar18._16_8_;
            auVar22._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar18._24_8_;
            auVar22._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar18._32_8_;
            auVar22._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar18._40_8_;
            auVar22._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar18._48_8_;
            auVar22._56_8_ = (uVar6 >> 7) * auVar18._56_8_;
            auVar18 = vaddpd_avx512f(auVar16,auVar22);
            vscatterdpd_avx512f(ZEXT864(pCVar10) + ZEXT3264(_DAT_00125360),uVar6,auVar18);
            uVar11 = uVar11 + 8;
            pCVar10 = pCVar10 + 8;
          } while (((ulong)((long)pCVar4 + lVar8) / 0x18 + 8 & 0xfffffffffffffff8) != uVar11);
        }
        B->constituents_exist_ = true;
      }
      pCVar4 = (A->constituents_).
               super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      dVar27 = 0.0;
      for (pCVar10 = (A->constituents_).
                     super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                     ._M_impl.super__Vector_impl_data._M_start; pCVar10 != pCVar4;
          pCVar10 = pCVar10 + 1) {
        pCVar5 = (B->constituents_).
                 super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pCVar12 = (B->constituents_).
                       super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
                       ._M_impl.super__Vector_impl_data._M_start; pCVar12 != pCVar5;
            pCVar12 = pCVar12 + 1) {
          auVar2._0_8_ = pCVar10->x;
          auVar2._8_8_ = pCVar10->y;
          auVar3._0_8_ = pCVar12->x;
          auVar3._8_8_ = pCVar12->y;
          auVar33 = vsubpd_avx(auVar2,auVar3);
          dVar26 = exp(((auVar33._0_8_ * auVar33._0_8_ + auVar33._8_8_ * auVar33._8_8_) * -0.25) /
                       this->constituent_width_sq_);
          dVar27 = dVar27 + dVar26;
        }
      }
      auVar28._8_8_ = 0;
      auVar28._0_8_ = this->sigma_partonic_;
      auVar7._8_8_ = 0x8000000000000000;
      auVar7._0_8_ = 0x8000000000000000;
      auVar13 = vxorpd_avx512vl(auVar28,auVar7);
      auVar33 = vcvtusi2sd_avx512f(in_XMM7,this->constituent_number_);
      dVar27 = exp(dVar27 * ((auVar13._0_8_ * this->prefactor_) / (auVar33._0_8_ + auVar33._0_8_)));
      dVar26 = std::
               generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                         ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                           *)&random::engine);
      bVar9 = dVar27 < dVar26;
      if (dVar27 < dVar26) {
        if (A->is_participant_ == false) {
          A->is_participant_ = true;
        }
        bVar9 = true;
        if (B->is_participant_ == false) {
          B->is_participant_ = true;
        }
      }
    }
    else {
      bVar9 = false;
    }
  }
  return bVar9;
}

Assistant:

inline bool NucleonCommon::participate(NucleonData& A, NucleonData& B) const {
  // If both nucleons are already participants, there's nothing to do.
  if (A.is_participant() && B.is_participant() && !calc_ncoll_)
    return true;

  auto distance_sq = sqr(A.x() - B.x()) + sqr(A.y() - B.y());

  // Check if nucleons are out of range.
  if (distance_sq > max_impact_sq_)
    return false;

  sample_constituent_positions(A);
  sample_constituent_positions(B);

  auto overlap = 0.;
  for (const auto& qA : A.constituents_) {
    for (const auto& qB : B.constituents_) {
      auto distance_sq = sqr(qA.x - qB.x) + sqr(qA.y - qB.y);
      overlap += std::exp(-.25*distance_sq/constituent_width_sq_);
    }
  }

  // The probability is
  //   P = 1 - exp(...)
  // which we could sample as
  //   P > U
  // where U is a standard uniform (0, 1) random number.  We can also compute
  //   1 - P = exp(...)
  // and then sample
  //   (1 - P) > (1 - U)
  // or equivalently
  //   (1 - P) < U
  auto one_minus_prob = std::exp(
      -sigma_partonic_ * prefactor_/(2.*constituent_number_) * overlap
      );

  // Sample one random number and decide if this pair participates.
  if (one_minus_prob < random::canonical<double>()) {
    set_participant(A);
    set_participant(B);
    return true;
  }

  return false;
}